

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O3

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  anon_enum_32 aVar1;
  size_t sVar2;
  archive *a;
  uint uVar3;
  int iVar4;
  size_t code;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ZSTD_inBuffer in;
  ZSTD_inBuffer local_48;
  
  local_48.pos = 0;
  output = &data->out;
  sVar7 = (data->out).pos;
  local_48.src = src;
  local_48.size = length;
  do {
    sVar2 = local_48.pos;
    aVar1 = data->state;
    if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,ZSTD_reset_session_only);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar1 == finishing) {
      code = ZSTD_endStream(data->cstream,output);
      uVar3 = ZSTD_isError(code);
      if (uVar3 != 0) {
LAB_0016a6ef:
        a = f->archive;
        pcVar5 = ZSTD_getErrorName(code);
        archive_set_error(a,-1,"Zstd compression failed: %s",pcVar5);
        return -0x1e;
      }
      if (code == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == running) {
      if (local_48.pos == local_48.size) {
        return 0;
      }
      code = ZSTD_compressStream(data->cstream,output,&local_48);
      uVar3 = ZSTD_isError(code);
      if (uVar3 != 0) goto LAB_0016a6ef;
    }
    data->total_in = data->total_in + (local_48.pos - sVar2);
    uVar6 = (local_48.pos - sVar2) + data->cur_frame_in;
    data->cur_frame_in = uVar6;
    sVar2 = (data->out).pos;
    data->cur_frame_out = data->cur_frame_out + (sVar2 - sVar7);
    if ((data->state == running) && (data->max_frame_size <= uVar6)) {
      data->state = finishing;
    }
    if ((sVar2 == (data->out).size) || (sVar7 = sVar2, flush != 0 && sVar2 != 0)) {
      iVar4 = __archive_write_filter(f->next_filter,output->dst,sVar2);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
      sVar7 = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK) {
				/* TODO: Handle this write failure */
				return (ARCHIVE_FATAL);
			}
			data->stream.next_out = data->compressed;
			data->stream.avail_out = (uint32_t)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = BZ2_bzCompress(&(data->stream),
		    finishing ? BZ_FINISH : BZ_RUN);

		switch (ret) {
		case BZ_RUN_OK:
			/* In non-finishing case, did compressor
			 * consume everything? */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			break;
		case BZ_FINISH_OK:  /* Finishing: There's more work to do */
			break;
		case BZ_STREAM_END: /* Finishing: all done */
			/* Only occurs in finishing case */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error */
			archive_set_error(f->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Bzip2 compression failed;"
			    " BZ2_bzCompress() returned %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}